

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makemon.c
# Opt level: O3

permonst * grow_up(monst *mtmp,monst *victim)

{
  byte bVar1;
  uchar uVar2;
  short sVar3;
  boolean bVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  obj *poVar8;
  char *pcVar9;
  char *pcVar10;
  char *pcVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  permonst *ptr;
  
  if (mtmp->mhp < 1) {
LAB_001bfcda:
    ptr = (permonst *)0x0;
  }
  else {
    ptr = mtmp->data;
    iVar5 = monsndx(ptr);
    iVar6 = little_to_big(iVar5);
    if (iVar6 == 0x161) {
      iVar6 = (*(uint *)&mtmp->field_0x60 & 1) + 0x161;
    }
    if (victim == (monst *)0x0) {
      uVar14 = mt_random();
      uVar14 = (uVar14 & 7) + 1;
      iVar13 = 0;
      uVar12 = 0x32;
      uVar7 = uVar14;
    }
    else {
      bVar1 = mtmp->m_lev;
      if (bVar1 == 0) {
        iVar13 = 4;
      }
      else if (ptr->mlet == '7') {
        iVar13 = (mtmp->mhpmax / 10) * 10 + 9;
      }
      else {
        bVar4 = is_home_elemental(&mtmp->dlevel->z,ptr);
        iVar13 = (uint)bVar1 * 0x18;
        if (bVar4 == '\0') {
          iVar13 = (uint)bVar1 * 8;
        }
      }
      sVar3 = ptr->mlevel * 3;
      uVar12 = (int)(short)(sVar3 - (sVar3 >> 0xf)) >> 1;
      if ((iVar5 != iVar6) && ((int)uVar12 <= (int)mons[iVar6].mlevel)) {
        uVar12 = (int)mons[iVar6].mlevel;
      }
      bVar1 = victim->m_lev;
      uVar7 = mt_random();
      uVar7 = uVar7 % (bVar1 + 1);
      uVar14 = (iVar13 + 1) - mtmp->mhpmax;
      if ((int)uVar14 < 1) {
        uVar14 = 0;
      }
      if ((int)(mtmp->mhpmax + uVar7 + 1) <= iVar13 + 1) {
        uVar14 = uVar7 + 1;
      }
      uVar7 = 0;
      if (1 < uVar14) {
        uVar7 = mt_random();
        uVar7 = uVar7 % uVar14;
      }
    }
    iVar15 = uVar14 + mtmp->mhpmax;
    mtmp->mhpmax = iVar15;
    mtmp->mhp = mtmp->mhp + uVar7;
    if (iVar15 <= iVar13) {
      return ptr;
    }
    uVar14 = 0x1e;
    if (((ptr < mons + 0x159 || mons + 0x168 < ptr) && (uVar14 = 5, 4 < (int)uVar12)) &&
       (uVar14 = uVar12, 0x31 < uVar12)) {
      uVar14 = ('1' < ptr->mlevel) + 0x31;
    }
    uVar2 = mtmp->m_lev;
    bVar1 = uVar2 + 1;
    mtmp->m_lev = bVar1;
    if ((iVar6 == iVar5) || ((int)(uint)bVar1 < (int)mons[iVar6].mlevel)) {
      if (bVar1 <= uVar14) goto LAB_001bff38;
      mtmp->m_lev = uVar2;
      iVar5 = mtmp->mhpmax;
      if (iVar5 == iVar13 + 1) {
        iVar5 = iVar5 + -1;
        mtmp->mhpmax = iVar5;
      }
    }
    else {
      ptr = mons + iVar6;
      if ((mvitals[iVar6].mvflags & 2) != 0) {
        if (((mtmp->data->mflags1 & 0x10000) == 0) &&
           ((poVar8 = which_armor(mtmp,4), poVar8 == (obj *)0x0 ||
            (poVar8 = which_armor(mtmp,4), poVar8->otyp != 0x4f)))) {
          if (u.uprops[0x1e].intrinsic == 0) {
            if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001bfad8;
            if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001bfad3;
LAB_001bfbcc:
            if ((u.uprops[0x19].extrinsic == 0) ||
               ((u.uprops[0x19].blocked != 0 ||
                (iVar5 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy), 0x40 < iVar5))))
            goto joined_r0x001bfc15;
          }
          else {
LAB_001bfad3:
            if (ublindf != (obj *)0x0) {
LAB_001bfad8:
              if (ublindf->oartifact == '\x1d') goto LAB_001bfbcc;
            }
            if ((((youmonst.data != mons + 0x31 && youmonst.data != mons + 0x1e) &&
                 (u.uprops[0x19].extrinsic == 0 && u.uprops[0x19].intrinsic == 0)) &&
                 youmonst.data != mons + 0x32) || (u.uprops[0x19].blocked != 0)) goto LAB_001bfbcc;
          }
LAB_001bfc37:
          pcVar9 = mon_nam(mtmp);
          pcVar10 = mons_mname(ptr);
          pcVar10 = an(pcVar10);
          iVar5 = pronoun_gender(level,mtmp);
          pcVar11 = "expires";
          if ((mons[iVar6].mlet != '7') &&
             (((mons[iVar6].mlet != '\x16' && ((mons[iVar6].mflags2 & 2) == 0)) &&
              (pcVar11 = "dies", iVar6 == 0x33)))) {
            pcVar11 = "expires";
          }
          pline("As %s grows up into %s, %s %s!",pcVar9,pcVar10,genders[iVar5].he,pcVar11);
        }
        else {
joined_r0x001bfc15:
          if ((u.uprops[0x42].intrinsic != 0) ||
             ((u.uprops[0x42].extrinsic != 0 || (bVar4 = match_warn_of_mon(mtmp), bVar4 != '\0'))))
          goto LAB_001bfc37;
        }
        set_mon_data(mtmp,ptr,-1);
        mondied(mtmp);
        goto LAB_001bfcda;
      }
      if (flags.verbose != '\0') {
        if (mtmp->wormno == '\0') {
          if ((viz_array[mtmp->my][mtmp->mx] & 2U) == 0) {
            if (u.uprops[0x1e].intrinsic == 0) {
              if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001bfb97;
              if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001bfb8e;
            }
            else {
LAB_001bfb8e:
              if (ublindf == (obj *)0x0) goto LAB_001bfd8f;
LAB_001bfb97:
              if (ublindf->oartifact != '\x1d') goto LAB_001bfd8f;
            }
            if (((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0) &&
                (((youmonst.data)->mflags3 & 0x100) == 0)) ||
               (((viz_array[mtmp->my][mtmp->mx] & 1U) == 0 || ((mtmp->data->mflags3 & 0x200) == 0)))
               ) goto LAB_001bfd8f;
          }
LAB_001bfd3a:
          uVar14 = *(uint *)&mtmp->field_0x60;
          if ((((uVar14 & 2) != 0) && (u.uprops[0xc].intrinsic == 0)) &&
             (u.uprops[0xc].extrinsic == 0)) {
            if (((uVar14 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0))
            goto LAB_001bfd82;
            goto LAB_001bfd8f;
          }
          if ((uVar14 & 0x280) != 0) goto LAB_001bfd8f;
LAB_001bfd82:
          if ((u._1052_1_ & 0x20) != 0) goto LAB_001bfd8f;
        }
        else {
          bVar4 = worm_known(level,mtmp);
          if (bVar4 != '\0') goto LAB_001bfd3a;
LAB_001bfd8f:
          if (((mtmp->data->mflags1 & 0x10000) == 0) &&
             ((poVar8 = which_armor(mtmp,4), poVar8 == (obj *)0x0 ||
              (poVar8 = which_armor(mtmp,4), poVar8->otyp != 0x4f)))) {
            if (u.uprops[0x1e].intrinsic == 0) {
              if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001bfde7;
              if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001bfde2;
            }
            else {
LAB_001bfde2:
              if (ublindf != (obj *)0x0) {
LAB_001bfde7:
                if (ublindf->oartifact == '\x1d') goto LAB_001bfe7a;
              }
              if ((((youmonst.data == mons + 0x31 || youmonst.data == mons + 0x1e) ||
                   (u.uprops[0x19].extrinsic != 0 || u.uprops[0x19].intrinsic != 0)) ||
                   youmonst.data == mons + 0x32) && (u.uprops[0x19].blocked == 0))
              goto LAB_001bfee1;
            }
LAB_001bfe7a:
            if ((u.uprops[0x19].extrinsic != 0) &&
               ((u.uprops[0x19].blocked == 0 &&
                (iVar5 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy), iVar5 < 0x41))))
            goto LAB_001bfee1;
          }
          if ((u.uprops[0x42].intrinsic == 0) &&
             ((u.uprops[0x42].extrinsic == 0 && (bVar4 = match_warn_of_mon(mtmp), bVar4 == '\0'))))
          goto LAB_001bff18;
        }
LAB_001bfee1:
        pcVar9 = y_monnam(mtmp);
        pcVar9 = upstart(pcVar9);
        pcVar10 = mons_mname(ptr);
        pcVar10 = an(pcVar10);
        pline("%s grows up into %s!",pcVar9,pcVar10);
      }
LAB_001bff18:
      set_mon_data(mtmp,ptr,1);
      newsym((int)mtmp->mx,(int)mtmp->my);
LAB_001bff38:
      iVar5 = mtmp->mhpmax;
    }
    if (400 < iVar5) {
      mtmp->mhpmax = 400;
      iVar5 = 400;
    }
    if (iVar5 < mtmp->mhp) {
      mtmp->mhp = iVar5;
    }
  }
  return ptr;
}

Assistant:

const struct permonst *grow_up(struct monst *mtmp, /* `mtmp' might "grow up" into a bigger version */
			 struct monst *victim)
{
	int oldtype, newtype, max_increase, cur_increase,
	    lev_limit, hp_threshold;
	const struct permonst *ptr = mtmp->data;

	/* monster died after killing enemy but before calling this function */
	/* currently possible if killing a gas spore */
	if (mtmp->mhp <= 0)
	    return NULL;

	/* note:  none of the monsters with special hit point calculations
	   have both little and big forms */
	oldtype = monsndx(ptr);
	newtype = little_to_big(oldtype);
	if (newtype == PM_PRIEST && mtmp->female) newtype = PM_PRIESTESS;

	/* growth limits differ depending on method of advancement */
	if (victim) {		/* killed a monster */
	    /*
	     * The HP threshold is the maximum number of hit points for the
	     * current level; once exceeded, a level will be gained.
	     * Possible bug: if somehow the hit points are already higher
	     * than that, monster will gain a level without any increase in HP.
	     */
	    hp_threshold = mtmp->m_lev * 8;		/* normal limit */
	    if (!mtmp->m_lev)
		hp_threshold = 4;
	    else if (is_golem(ptr))	/* strange creatures */
		hp_threshold = ((mtmp->mhpmax / 10) + 1) * 10 - 1;
	    else if (is_home_elemental(&mtmp->dlevel->z, ptr))
		hp_threshold *= 3;
	    lev_limit = 3 * (int)ptr->mlevel / 2;	/* same as adj_lev() */
	    /* If they can grow up, be sure the level is high enough for that */
	    if (oldtype != newtype && mons[newtype].mlevel > lev_limit)
		lev_limit = (int)mons[newtype].mlevel;
	    /* number of hit points to gain; unlike for the player, we put
	       the limit at the bottom of the next level rather than the top */
	    max_increase = rnd((int)victim->m_lev + 1);
	    if (mtmp->mhpmax + max_increase > hp_threshold + 1)
		max_increase = max((hp_threshold + 1) - mtmp->mhpmax, 0);
	    cur_increase = (max_increase > 1) ? rn2(max_increase) : 0;
	} else {
	    /* a gain level potion or wraith corpse; always go up a level
	       unless already at maximum (49 is hard upper limit except
	       for demon lords, who start at 50 and can't go any higher) */
	    max_increase = cur_increase = rnd(8);
	    hp_threshold = 0;	/* smaller than `mhpmax + max_increase' */
	    lev_limit = 50;		/* recalc below */
	}

	mtmp->mhpmax += max_increase;
	mtmp->mhp += cur_increase;
	if (mtmp->mhpmax <= hp_threshold)
	    return ptr;		/* doesn't gain a level */

	if (is_mplayer(ptr)) lev_limit = 30;	/* same as player */
	else if (lev_limit < 5) lev_limit = 5;	/* arbitrary */
	else if (lev_limit > 49) lev_limit = (ptr->mlevel > 49 ? 50 : 49);

	if ((int)++mtmp->m_lev >= mons[newtype].mlevel && newtype != oldtype) {
	    ptr = &mons[newtype];
	    if (mvitals[newtype].mvflags & G_GENOD) {	/* allow G_EXTINCT */
		if (sensemon(mtmp))
		    pline("As %s grows up into %s, %s %s!", mon_nam(mtmp),
			an(mons_mname(ptr)), mhe(level, mtmp),
			nonliving(ptr) ? "expires" : "dies");
		set_mon_data(mtmp, ptr, -1);	/* keep mvitals[] accurate */
		mondied(mtmp);
		return NULL;
	    }
	    if (flags.verbose && canspotmon(level, mtmp)) {
		pline("%s grows up into %s!",
		      upstart(y_monnam(mtmp)), an(mons_mname(ptr)));
	    }
	    set_mon_data(mtmp, ptr, 1);		/* preserve intrinsics */
	    newsym(mtmp->mx, mtmp->my);		/* color may change */
	    lev_limit = (int)mtmp->m_lev;	/* never undo increment */
	}
	/* sanity checks */
	if ((int)mtmp->m_lev > lev_limit) {
	    mtmp->m_lev--;	/* undo increment */
	    /* HP might have been allowed to grow when it shouldn't */
	    if (mtmp->mhpmax == hp_threshold + 1) mtmp->mhpmax--;
	}
	if (mtmp->mhpmax > 50*8) mtmp->mhpmax = 50*8;	  /* absolute limit */
	if (mtmp->mhp > mtmp->mhpmax) mtmp->mhp = mtmp->mhpmax;

	return ptr;
}